

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong in_RDX;
  ulong *in_RSI;
  ZSTD_DCtx *in_RDI;
  void *unaff_retaddr;
  ZSTD_DCtx *in_stack_00000008;
  size_t err_code_1;
  size_t decodedSize_1;
  size_t dstSize_1;
  size_t err_code;
  size_t decodedSize;
  size_t dstSize;
  int isSkipFrame;
  size_t in_stack_fffffffffffffff8;
  
  iVar1 = ZSTD_isSkipFrame(in_RDI);
  if (in_RDI->outBufferMode == ZSTD_bm_buffered) {
    sVar3 = ZSTD_decompressContinue
                      (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                       (size_t)in_RSI);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 != 0) {
      return sVar3;
    }
    if ((sVar3 == 0) && (iVar1 == 0)) {
      in_RDI->streamStage = zdss_read;
    }
    else {
      in_RDI->outEnd = in_RDI->outStart + sVar3;
      in_RDI->streamStage = zdss_flush;
    }
  }
  else {
    sVar3 = ZSTD_decompressContinue
                      (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                       (size_t)in_RSI);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 != 0) {
      return sVar3;
    }
    *in_RSI = sVar3 + *in_RSI;
    in_RDI->streamStage = zdss_read;
    if (in_RDX < *in_RSI) {
      __assert_fail("*op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa338,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
    if (in_RDI->outBufferMode != ZSTD_bm_stable) {
      __assert_fail("zds->outBufferMode == ZSTD_bm_stable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa339,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
  }
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}